

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall wasm::PostEmscripten::removeExports(PostEmscripten *this,Module *module)

{
  pointer pAVar1;
  bool bVar2;
  PassOptions *this_00;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  allocator<char> local_71;
  string local_70;
  undefined1 local_49;
  PassOptions *pPStack_48;
  bool sideModule;
  PassOptions *options;
  undefined1 local_30 [8];
  vector<wasm::Address,_std::allocator<wasm::Address>_> segmentOffsets;
  Module *module_local;
  PostEmscripten *this_local;
  
  segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)module;
  std::vector<wasm::Address,_std::allocator<wasm::Address>_>::vector
            ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30);
  anon_unknown_0::calcSegmentOffsets
            ((Module *)
             segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30);
  this_00 = Pass::getPassOptions(&this->super_Pass);
  pPStack_48 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"post-emscripten-side-module",&local_71);
  bVar2 = PassOptions::hasArgument(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_49 = bVar2;
  if (!bVar2) {
    wasm::Name::Name((Name *)&local_88,"__start_em_asm");
    wasm::Name::Name((Name *)&local_98,"__stop_em_asm");
    anon_unknown_0::removeData
              ((Module *)pAVar1,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30,
               (Name)local_88,(Name)local_98);
    pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    wasm::Name::Name((Name *)&local_a8,"__start_em_asm");
    Module::removeExport((Module *)pAVar1,(Name)local_a8);
    pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    wasm::Name::Name((Name *)&local_b8,"__stop_em_asm");
    Module::removeExport((Module *)pAVar1,(Name)local_b8);
  }
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_c8,"__start_em_js");
  wasm::Name::Name((Name *)&local_d8,"__stop_em_js");
  anon_unknown_0::removeData
            ((Module *)pAVar1,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30,
             (Name)local_c8,(Name)local_d8);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_e8,"__start_em_lib_deps");
  wasm::Name::Name((Name *)&local_f8,"__stop_em_lib_deps");
  anon_unknown_0::removeData
            ((Module *)pAVar1,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30,
             (Name)local_e8,(Name)local_f8);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_108,"__start_em_js");
  Module::removeExport((Module *)pAVar1,(Name)local_108);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_118,"__stop_em_js");
  Module::removeExport((Module *)pAVar1,(Name)local_118);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_128,"__start_em_lib_deps");
  Module::removeExport((Module *)pAVar1,(Name)local_128);
  pAVar1 = segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  wasm::Name::Name((Name *)&local_138,"__stop_em_lib_deps");
  Module::removeExport((Module *)pAVar1,(Name)local_138);
  std::vector<wasm::Address,_std::allocator<wasm::Address>_>::~vector
            ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)local_30);
  return;
}

Assistant:

void removeExports(Module& module) {
    std::vector<Address> segmentOffsets; // segment index => address offset
    calcSegmentOffsets(module, segmentOffsets);

    auto& options = getPassOptions();
    auto sideModule = options.hasArgument("post-emscripten-side-module");
    if (!sideModule) {
      // Side modules read EM_ASM data from the module based on these exports
      // so we need to keep them around in that case.
      removeData(module, segmentOffsets, "__start_em_asm", "__stop_em_asm");
      module.removeExport("__start_em_asm");
      module.removeExport("__stop_em_asm");
    }

    removeData(module, segmentOffsets, "__start_em_js", "__stop_em_js");
    removeData(
      module, segmentOffsets, "__start_em_lib_deps", "__stop_em_lib_deps");
    module.removeExport("__start_em_js");
    module.removeExport("__stop_em_js");
    module.removeExport("__start_em_lib_deps");
    module.removeExport("__stop_em_lib_deps");
  }